

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_Tt6CofactorPermNaive(word *pTruth,int i,int fSwapOnly)

{
  int iVar;
  word Truth;
  uint uVar1;
  ulong uVar2;
  word Truth_00;
  word Truth_01;
  word Truth_02;
  word Truth_03;
  word Truth_04;
  word Truth_05;
  word Truth_06;
  word wVar3;
  uint uVar4;
  ulong uVar5;
  
  Truth = *pTruth;
  if (fSwapOnly == 0) {
    Truth_00 = Abc_Tt6Flip(Truth,i);
    iVar = i + 1;
    Truth_01 = Abc_Tt6Flip(Truth_00,iVar);
    Truth_02 = Abc_Tt6Flip(Truth_01,i);
    Truth_03 = Abc_Tt6SwapAdjacent(Truth_02,i);
    Truth_04 = Abc_Tt6Flip(Truth_03,iVar);
    Truth_05 = Abc_Tt6Flip(Truth_04,i);
    Truth_06 = Abc_Tt6Flip(Truth_05,iVar);
    wVar3 = Abc_Tt6SwapAdjacent(Truth_06,i);
    if (wVar3 != Truth) {
      __assert_fail("Copy == pTruth[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x315,"int Abc_Tt6CofactorPermNaive(word *, int, int)");
    }
    wVar3 = Truth_00;
    if (Truth < Truth_00) {
      wVar3 = Truth;
    }
    uVar2 = wVar3;
    if (Truth_01 <= wVar3) {
      uVar2 = Truth_01;
    }
    uVar4 = 3;
    if (wVar3 <= Truth_01) {
      uVar4 = (uint)(Truth_00 < Truth);
    }
    uVar5 = uVar2;
    if (Truth_02 <= uVar2) {
      uVar5 = Truth_02;
    }
    uVar1 = 2;
    if (uVar2 <= Truth_02) {
      uVar1 = uVar4;
    }
    uVar2 = uVar5;
    if (Truth_03 <= uVar5) {
      uVar2 = Truth_03;
    }
    uVar4 = 6;
    if (uVar5 <= Truth_03) {
      uVar4 = uVar1;
    }
    uVar5 = uVar2;
    if (Truth_04 <= uVar2) {
      uVar5 = Truth_04;
    }
    uVar1 = 7;
    if (uVar2 <= Truth_04) {
      uVar1 = uVar4;
    }
    uVar2 = uVar5;
    if (Truth_05 <= uVar5) {
      uVar2 = Truth_05;
    }
    uVar4 = 5;
    if (uVar5 <= Truth_05) {
      uVar4 = uVar1;
    }
    uVar1 = 4;
    if (Truth_06 > uVar2 || uVar2 == Truth_06) {
      uVar1 = uVar4;
    }
    if (Truth_06 <= uVar2) {
      uVar2 = Truth_06;
    }
    if (Truth < uVar2) {
      __assert_fail("Best <= pTruth[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x316,"int Abc_Tt6CofactorPermNaive(word *, int, int)");
    }
  }
  else {
    uVar2 = Abc_Tt6SwapAdjacent(Truth,i);
    if (Truth <= uVar2) {
      return 0;
    }
    uVar1 = 4;
  }
  *pTruth = uVar2;
  return uVar1;
}

Assistant:

int Abc_Tt6CofactorPermNaive( word * pTruth, int i, int fSwapOnly )
{
    if ( fSwapOnly )
    {
        word Copy = Abc_Tt6SwapAdjacent( pTruth[0], i );
        if ( pTruth[0] > Copy )
        {
            pTruth[0] = Copy;
            return 4;
        }
        return 0;
    }
    {
        word Copy = pTruth[0];
        word Best = pTruth[0];
        int Config = 0;
        // PXY
        // 001
        Copy = Abc_Tt6Flip( Copy, i );
        if ( Best > Copy )
            Best = Copy, Config = 1;
        // PXY
        // 011
        Copy = Abc_Tt6Flip( Copy, i+1 );
        if ( Best > Copy )
            Best = Copy, Config = 3;
        // PXY
        // 010
        Copy = Abc_Tt6Flip( Copy, i );
        if ( Best > Copy )
            Best = Copy, Config = 2;
        // PXY
        // 110
        Copy = Abc_Tt6SwapAdjacent( Copy, i );
        if ( Best > Copy )
            Best = Copy, Config = 6;
        // PXY
        // 111
        Copy = Abc_Tt6Flip( Copy, i+1 );
        if ( Best > Copy )
            Best = Copy, Config = 7;
        // PXY
        // 101
        Copy = Abc_Tt6Flip( Copy, i );
        if ( Best > Copy )
            Best = Copy, Config = 5;
        // PXY
        // 100
        Copy = Abc_Tt6Flip( Copy, i+1 );
        if ( Best > Copy )
            Best = Copy, Config = 4;
        // PXY
        // 000
        Copy = Abc_Tt6SwapAdjacent( Copy, i );
        assert( Copy == pTruth[0] );
        assert( Best <= pTruth[0] );
        pTruth[0] = Best;
        return Config;
    }
}